

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O2

char * __thiscall
TiXmlText::Parse(TiXmlText *this,char *p,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  TiXmlString *this_00;
  bool bVar1;
  TiXmlDocument *this_01;
  char *pcVar2;
  TiXmlString dummy;
  
  this_00 = &(this->super_TiXmlNode).value;
  TiXmlString::operator=(this_00,"");
  this_01 = TiXmlNode::GetDocument(&this->super_TiXmlNode);
  if (data != (TiXmlParsingData *)0x0) {
    TiXmlParsingData::Stamp(data,p,encoding);
    (this->super_TiXmlNode).super_TiXmlBase.location = data->cursor;
  }
  if ((this->cdata != false) ||
     (bVar1 = TiXmlBase::StringEqual(p,"<![CDATA[",false,encoding), bVar1)) {
    this->cdata = true;
    bVar1 = TiXmlBase::StringEqual(p,"<![CDATA[",false,encoding);
    if (bVar1) {
      pcVar2 = p + 9;
      while ((*pcVar2 != '\0' &&
             (bVar1 = TiXmlBase::StringEqual(pcVar2,"]]>",false,encoding), !bVar1))) {
        TiXmlString::operator+=(this_00,*pcVar2);
        pcVar2 = pcVar2 + 1;
      }
      dummy.rep_ = &TiXmlString::nullrep_;
      pcVar2 = TiXmlBase::ReadText(pcVar2,&dummy,false,"]]>",false,encoding);
      TiXmlString::quit(&dummy);
    }
    else {
      if (this_01 != (TiXmlDocument *)0x0) {
        TiXmlDocument::SetError(this_01,0xe,p,data,encoding);
      }
      pcVar2 = (char *)0x0;
    }
    return pcVar2;
  }
  pcVar2 = TiXmlBase::ReadText(p,this_00,true,"<",false,encoding);
  if (pcVar2 == (char *)0x0) {
    return (char *)0x0;
  }
  if (*pcVar2 == '\0') {
    return (char *)0x0;
  }
  return pcVar2 + -1;
}

Assistant:

const char* TiXmlText::Parse( const char* p, TiXmlParsingData* data, TiXmlEncoding encoding )
{
	value = "";
	TiXmlDocument* document = GetDocument();

	if ( data )
	{
		data->Stamp( p, encoding );
		location = data->Cursor();
	}

	const char* const startTag = "<![CDATA[";
	const char* const endTag   = "]]>";

	if ( cdata || StringEqual( p, startTag, false, encoding ) )
	{
		cdata = true;

		if ( !StringEqual( p, startTag, false, encoding ) )
		{
			if ( document )
				document->SetError( TIXML_ERROR_PARSING_CDATA, p, data, encoding );
			return 0;
		}
		p += strlen( startTag );

		// Keep all the white space, ignore the encoding, etc.
		while (	   p && *p
				&& !StringEqual( p, endTag, false, encoding )
			  )
		{
			value += *p;
			++p;
		}

		TIXML_STRING dummy; 
		p = ReadText( p, &dummy, false, endTag, false, encoding );
		return p;
	}
	else
	{
		bool ignoreWhite = true;

		const char* end = "<";
		p = ReadText( p, &value, ignoreWhite, end, false, encoding );
		if ( p && *p )
			return p-1;	// don't truncate the '<'
		return 0;
	}
}